

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::NextBuffer
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  int *piVar2;
  byte bVar3;
  char *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  uint uVar7;
  LogMessage *pLVar8;
  char *p;
  char *pcVar9;
  long lVar10;
  uint uVar11;
  LogMessage *unaff_R12;
  size_t __n;
  int iVar12;
  pair<const_char_*,_int> pVar13;
  void *data;
  LogFinisher local_e1;
  char *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (this->next_chunk_ == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = this->buffer_;
  if (this->next_chunk_ != pcVar1) {
    if (this->size_ < 0x11) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                 ,0x69);
      pLVar8 = LogMessage::operator<<(&local_d8,"CHECK failed: size_ > kSlopBytes: ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar8);
      LogMessage::~LogMessage(&local_d8);
    }
    pcVar4 = this->next_chunk_;
    this->buffer_end_ = pcVar4 + (long)this->size_ + -0x10;
    this->next_chunk_ = pcVar1;
    if (this->aliasing_ != 1) {
      return pcVar4;
    }
    this->aliasing_ = 2;
    return pcVar4;
  }
  uVar6 = *(undefined8 *)(this->buffer_end_ + 8);
  *(undefined8 *)pcVar1 = *(undefined8 *)this->buffer_end_;
  *(undefined8 *)(this->buffer_ + 8) = uVar6;
  if (0 < this->overall_limit_) {
    if (-1 < depth) {
      if (overrun < 0) {
        unaff_R12 = &local_d8;
        LogMessage::LogMessage
                  (unaff_R12,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0x35);
        pLVar8 = LogMessage::operator<<(unaff_R12,"CHECK failed: overrun >= 0: ");
        LogFinisher::operator=((LogFinisher *)&local_68,pLVar8);
        LogMessage::~LogMessage(&local_d8);
      }
      if (0x10 < overrun) {
        unaff_R12 = &local_68;
        LogMessage::LogMessage
                  (unaff_R12,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                   ,0x36);
        pLVar8 = LogMessage::operator<<(unaff_R12,"CHECK failed: overrun <= kSlopBytes: ");
        LogFinisher::operator=((LogFinisher *)&local_a0,pLVar8);
        LogMessage::~LogMessage(&local_68);
      }
      pcVar4 = this->buffer_ + 0x10;
      pcVar9 = pcVar1 + overrun;
      do {
        if (pcVar4 <= pcVar9) goto LAB_003259ed;
        bVar3 = *pcVar9;
        p = pcVar9 + 1;
        uVar7 = (uint)bVar3;
        if ((char)bVar3 < '\0') {
          uVar11 = ((uint)bVar3 + (uint)(byte)*p * 0x80) - 0x80;
          if (*p < '\0') {
            lVar10 = -0x15;
            pcVar9 = pcVar9 + 3;
            do {
              p = pcVar9;
              uVar11 = ((byte)p[-1] - 1 << ((char)lVar10 + 0x23U & 0x1f)) + uVar11;
              uVar7 = uVar11;
              if (-1 < p[-1]) break;
              pcVar9 = p + 1;
              p = (char *)0x0;
              lVar10 = lVar10 + 7;
              uVar7 = 0;
            } while (lVar10 != 0);
          }
          else {
            p = pcVar9 + 2;
            uVar7 = uVar11;
          }
        }
        if (pcVar4 < p || p == (char *)0x0) {
switchD_003258dd_default:
          bVar5 = false;
          unaff_R12 = (LogMessage *)0x0;
        }
        else {
          iVar12 = depth;
          if (uVar7 == 0) {
LAB_0032590d:
            bVar5 = false;
            unaff_R12 = (LogMessage *)0x1;
            depth = iVar12;
          }
          else {
            switch(uVar7 & 7) {
            case 0:
              p = VarintParse<unsigned_long>(p,(unsigned_long *)&local_a0);
              unaff_R12 = (LogMessage *)(ulong)((byte)unaff_R12 & p != (char *)0x0);
              if (p == (char *)0x0) {
                bVar5 = false;
                goto LAB_003259bb;
              }
              break;
            case 1:
              p = p + 8;
              break;
            case 2:
              bVar3 = *p;
              uVar7 = (uint)bVar3;
              if ((char)bVar3 < '\0') {
                pVar13 = ReadSizeFallback(p,(uint)bVar3);
                uVar7 = pVar13.second;
                p = pVar13.first;
              }
              else {
                p = p + 1;
              }
              if ((p == (char *)0x0) || ((long)pcVar4 - (long)p < (long)(int)uVar7)) {
                bVar5 = false;
                unaff_R12 = (LogMessage *)0x0;
              }
              else {
                p = p + (int)uVar7;
                bVar5 = true;
              }
              if (!bVar5) {
                bVar5 = false;
                goto LAB_003259bb;
              }
              break;
            case 3:
              depth = depth + 1;
              break;
            case 4:
              iVar12 = depth + -1;
              bVar5 = depth < 1;
              depth = iVar12;
              if (bVar5) goto LAB_0032590d;
              break;
            case 5:
              p = p + 4;
              break;
            default:
              goto switchD_003258dd_default;
            }
            bVar5 = true;
          }
        }
LAB_003259bb:
        pcVar9 = p;
      } while (bVar5);
      if (((ulong)unaff_R12 & 1) != 0) goto LAB_00325ae9;
    }
LAB_003259ed:
    piVar2 = &this->size_;
    uVar7 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_e0,piVar2);
    if ((char)uVar7 != '\0') {
      do {
        iVar12 = this->size_;
        __n = (size_t)iVar12;
        this->overall_limit_ = this->overall_limit_ - iVar12;
        if (0x10 < (long)__n) {
          uVar6 = *(undefined8 *)(local_e0 + 8);
          *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_e0;
          *(undefined8 *)(this->buffer_ + 0x18) = uVar6;
          this->next_chunk_ = local_e0;
          this->buffer_end_ = this->buffer_ + 0x10;
LAB_00325ad4:
          if (1 < this->aliasing_) {
            this->aliasing_ = 1;
          }
          goto LAB_00325ae3;
        }
        if (0 < iVar12) {
          memcpy(this->buffer_ + 0x10,local_e0,__n);
          this->next_chunk_ = pcVar1;
          this->buffer_end_ = pcVar1 + __n;
          goto LAB_00325ad4;
        }
        if (iVar12 != 0) {
          LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.cc"
                     ,0x89);
          pLVar8 = LogMessage::operator<<(&local_a0,"CHECK failed: size_ == 0: ");
          pLVar8 = LogMessage::operator<<(pLVar8,*piVar2);
          LogFinisher::operator=(&local_e1,pLVar8);
          LogMessage::~LogMessage(&local_a0);
        }
        uVar7 = (*this->zcis_->_vptr_ZeroCopyInputStream[2])(this->zcis_,&local_e0,piVar2);
      } while ((char)uVar7 != '\0');
    }
    this->overall_limit_ = 0;
LAB_00325ae3:
    if ((uVar7 & 1) != 0) {
      return pcVar1;
    }
  }
LAB_00325ae9:
  if (this->aliasing_ == 2) {
    this->aliasing_ = (long)this->buffer_end_ - (long)pcVar1;
  }
  this->next_chunk_ = (char *)0x0;
  this->buffer_end_ = this->buffer_ + 0x10;
  this->size_ = 0;
  return pcVar1;
}

Assistant:

const char* EpsCopyInputStream::NextBuffer(int overrun, int depth) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (depth < 0 || !ParseEndsInSlopRegion(buffer_, overrun, depth))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}